

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

void __thiscall AllDiffBoundsImp<0>::sortit(AllDiffBoundsImp<0> *this)

{
  int iVar1;
  int *piVar2;
  IntView<0> *pIVar3;
  interval *piVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  
  uVar6 = (ulong)(uint)this->sz;
  piVar2 = this->minsorted;
  pIVar3 = this->x;
  piVar4 = this->iv;
  while (0 < (int)uVar6) {
    uVar6 = uVar6 - 1;
    uVar10 = uVar6 & 0xffffffff;
    iVar9 = piVar2[uVar6];
    piVar12 = &piVar4[iVar9].min;
    *piVar12 = ((pIVar3[iVar9].var)->min).v;
    while (((int)uVar10 < this->sz + -1 && (piVar4[piVar2[uVar10 + 1]].min <= *piVar12))) {
      piVar2[uVar10] = piVar2[uVar10 + 1];
      uVar10 = uVar10 + 1;
    }
    piVar2[uVar10 & 0xffffffff] = iVar9;
  }
  uVar6 = (ulong)(uint)this->sz;
  piVar12 = this->maxsorted;
  pIVar3 = this->x;
  piVar4 = this->iv;
  while (0 < (int)uVar6) {
    uVar6 = uVar6 - 1;
    uVar10 = uVar6 & 0xffffffff;
    iVar9 = piVar12[uVar6];
    piVar4[iVar9].max = ((pIVar3[iVar9].var)->max).v + 1;
    while (((int)uVar10 < this->sz + -1 && (piVar4[piVar12[uVar10 + 1]].max <= piVar4[iVar9].max)))
    {
      piVar12[uVar10] = piVar12[uVar10 + 1];
      uVar10 = uVar10 + 1;
    }
    piVar12[uVar10 & 0xffffffff] = iVar9;
  }
  iVar14 = piVar4[*piVar2].min;
  iVar1 = piVar4[*piVar12].max;
  iVar9 = iVar14 + -2;
  piVar5 = this->bounds;
  *piVar5 = iVar9;
  this->nb = 0;
  iVar7 = this->sz;
  iVar8 = 0;
  iVar11 = 0;
  iVar13 = 0;
LAB_0014536a:
  do {
    piVar15 = piVar2 + iVar13;
    do {
      if ((iVar7 <= iVar13) || (iVar1 < iVar14)) {
        if (iVar1 != iVar9) {
          this->nb = iVar8 + 1;
          piVar5[(long)iVar8 + 1] = iVar1;
          iVar7 = this->sz;
          iVar8 = this->nb;
        }
        piVar4[piVar12[iVar11]].maxrank = iVar8;
        iVar11 = iVar11 + 1;
        if (iVar11 == iVar7) {
          piVar5[(long)iVar8 + 1] = piVar5[iVar8] + 2;
          return;
        }
        iVar9 = iVar1;
        iVar1 = piVar4[piVar12[iVar11]].max;
        goto LAB_0014536a;
      }
      if (iVar14 != iVar9) {
        this->nb = iVar8 + 1;
        piVar5[(long)iVar8 + 1] = iVar14;
        iVar7 = this->sz;
        iVar8 = this->nb;
      }
      piVar4[*piVar15].minrank = iVar8;
      iVar13 = iVar13 + 1;
      piVar15 = piVar15 + 1;
      iVar9 = iVar14;
    } while (iVar7 <= iVar13);
    iVar14 = piVar4[piVar2[iVar13]].min;
  } while( true );
}

Assistant:

void sortit() {
		int i;
		int j;
		int min;
		int max;
		int last;

		for (int i = sz - 1; i >= 0; --i) {
			const int t = minsorted[i];
			iv[t].min = static_cast<int>(x[t].getMin());
			int j;
			for (j = i; j < sz - 1; ++j) {
				if (iv[t].min < iv[minsorted[j + 1]].min) {
					break;
				}
				minsorted[j] = minsorted[j + 1];
			}
			minsorted[j] = t;
		}
		for (int i = sz - 1; i >= 0; --i) {
			const int t = maxsorted[i];
			iv[t].max = static_cast<int>(x[t].getMax()) + 1;
			int j;
			for (j = i; j < sz - 1; ++j) {
				if (iv[t].max < iv[maxsorted[j + 1]].max) {
					break;
				}
				maxsorted[j] = maxsorted[j + 1];
			}
			maxsorted[j] = t;
		}

		min = iv[minsorted[0]].min;
		max = iv[maxsorted[0]].max;
		bounds[0] = last = min - 2;

		for (i = j = nb = 0;;) {       // merge minsorted[] and maxsorted[] into bounds[]
			if (i < sz && min <= max) {  // make sure minsorted exhausted first
				if (min != last) {
					bounds[++nb] = last = min;
				}
				iv[minsorted[i]].minrank = nb;
				if (++i < sz) {
					min = iv[minsorted[i]].min;
				}
			} else {
				if (max != last) {
					bounds[++nb] = last = max;
				}
				iv[maxsorted[j]].maxrank = nb;
				if (++j == sz) {
					break;
				}
				max = iv[maxsorted[j]].max;
			}
		}
		bounds[nb + 1] = bounds[nb] + 2;
	}